

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_SelfAssign_Test::~RepeatedField_SelfAssign_Test
          (RepeatedField_SelfAssign_Test *this)

{
  RepeatedField_SelfAssign_Test *this_local;
  
  ~RepeatedField_SelfAssign_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedField, SelfAssign) {
  // Verify that assignment to self does not destroy data.
  RepeatedField<int> source, *p;
  p = &source;
  source.Add(7);
  source.Add(8);

  *p = source;

  ASSERT_EQ(2, source.size());
  EXPECT_EQ(7, source.Get(0));
  EXPECT_EQ(8, source.Get(1));
}